

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O1

void cleanup_summon(void)

{
  monster_base_list *pmVar1;
  monster_base_list *p;
  long lVar2;
  
  if (L'\0' < summon_max) {
    lVar2 = 0;
    do {
      p = summons[lVar2].bases;
      while (p != (monster_base_list *)0x0) {
        pmVar1 = p->next;
        mem_free(p);
        p = pmVar1;
      }
      string_free(summons[lVar2].desc);
      string_free(summons[lVar2].fallback_name);
      string_free(summons[lVar2].name);
      lVar2 = lVar2 + 1;
    } while (lVar2 < summon_max);
  }
  mem_free(summons);
  return;
}

Assistant:

static void cleanup_summon(void)
{
	int idx;
	for (idx = 0; idx < summon_max; idx++) {
		struct monster_base_list *s = summons[idx].bases;
		while (s) {
			struct monster_base_list *next = s->next;
			mem_free(s);
			s = next;
		}
		string_free(summons[idx].desc);
		string_free(summons[idx].fallback_name);
		string_free(summons[idx].name);
	}
	mem_free(summons);
}